

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alter_table_info.cpp
# Opt level: O1

void __thiscall
duckdb::RenameFieldInfo::RenameFieldInfo
          (RenameFieldInfo *this,AlterEntryData *data,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          *column_path_p,string *new_name_p)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  pointer pcVar4;
  pointer pbVar5;
  undefined8 uVar6;
  AlterEntryData local_98;
  
  local_98.catalog._M_dataplus._M_p = (pointer)&local_98.catalog.field_2;
  paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(data->catalog)._M_dataplus._M_p;
  paVar1 = &(data->catalog).field_2;
  if (paVar3 == paVar1) {
    local_98.catalog.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_98.catalog.field_2._8_8_ = *(undefined8 *)((long)&(data->catalog).field_2 + 8);
  }
  else {
    local_98.catalog.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_98.catalog._M_dataplus._M_p = (pointer)paVar3;
  }
  local_98.catalog._M_string_length = (data->catalog)._M_string_length;
  paVar3 = &local_98.schema.field_2;
  (data->catalog)._M_dataplus._M_p = (pointer)paVar1;
  (data->catalog)._M_string_length = 0;
  (data->catalog).field_2._M_local_buf[0] = '\0';
  local_98.schema._M_dataplus._M_p = (data->schema)._M_dataplus._M_p;
  paVar1 = &(data->schema).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.schema._M_dataplus._M_p == paVar1) {
    local_98.schema.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_98.schema.field_2._8_8_ = *(undefined8 *)((long)&(data->schema).field_2 + 8);
    local_98.schema._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_98.schema.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  local_98.schema._M_string_length = (data->schema)._M_string_length;
  paVar2 = &local_98.name.field_2;
  (data->schema)._M_dataplus._M_p = (pointer)paVar1;
  (data->schema)._M_string_length = 0;
  (data->schema).field_2._M_local_buf[0] = '\0';
  local_98.name._M_dataplus._M_p = (data->name)._M_dataplus._M_p;
  paVar1 = &(data->name).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.name._M_dataplus._M_p == paVar1) {
    local_98.name.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_98.name.field_2._8_8_ = *(undefined8 *)((long)&(data->name).field_2 + 8);
    local_98.name._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_98.name.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  local_98.name._M_string_length = (data->name)._M_string_length;
  (data->name)._M_dataplus._M_p = (pointer)paVar1;
  (data->name)._M_string_length = 0;
  (data->name).field_2._M_local_buf[0] = '\0';
  local_98.if_not_found = data->if_not_found;
  AlterTableInfo::AlterTableInfo(&this->super_AlterTableInfo,RENAME_FIELD,&local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.name._M_dataplus._M_p != paVar2) {
    operator_delete(local_98.name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.schema._M_dataplus._M_p != paVar3) {
    operator_delete(local_98.schema._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.catalog._M_dataplus._M_p != &local_98.catalog.field_2) {
    operator_delete(local_98.catalog._M_dataplus._M_p);
  }
  (this->super_AlterTableInfo).super_AlterInfo.super_ParseInfo._vptr_ParseInfo =
       (_func_int **)&PTR__RenameFieldInfo_0247d530;
  pbVar5 = (column_path_p->
           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (this->column_path).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (column_path_p->
       super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->column_path).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = pbVar5;
  (this->column_path).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (column_path_p->
       super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (column_path_p->
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (column_path_p->
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (column_path_p->
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  paVar3 = &(this->new_name).field_2;
  (this->new_name)._M_dataplus._M_p = (pointer)paVar3;
  pcVar4 = (new_name_p->_M_dataplus)._M_p;
  paVar1 = &new_name_p->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 == paVar1) {
    uVar6 = *(undefined8 *)((long)&new_name_p->field_2 + 8);
    paVar3->_M_allocated_capacity = paVar1->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->new_name).field_2 + 8) = uVar6;
  }
  else {
    (this->new_name)._M_dataplus._M_p = pcVar4;
    (this->new_name).field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  (this->new_name)._M_string_length = new_name_p->_M_string_length;
  (new_name_p->_M_dataplus)._M_p = (pointer)paVar1;
  new_name_p->_M_string_length = 0;
  (new_name_p->field_2)._M_local_buf[0] = '\0';
  return;
}

Assistant:

RenameFieldInfo::RenameFieldInfo(AlterEntryData data, vector<string> column_path_p, string new_name_p)
    : AlterTableInfo(AlterTableType::RENAME_FIELD, std::move(data)), column_path(std::move(column_path_p)),
      new_name(std::move(new_name_p)) {
}